

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::RandomOrderTexImageCubeCase::RandomOrderTexImageCubeCase
          (RandomOrderTexImageCubeCase *this,Context *context,char *name,char *desc,
          deUint32 internalFormat,int size)

{
  TransferFormat TVar1;
  uint uVar2;
  TextureFormat local_38;
  
  local_38 = glu::mapGLInternalFormat(internalFormat);
  uVar2 = 0x20;
  if (size != 0) {
    uVar2 = 0x1f;
    if (size != 0) {
      for (; (uint)size >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  TextureCubeSpecCase::TextureCubeSpecCase
            (&this->super_TextureCubeSpecCase,context,name,desc,&local_38,size,0x20 - uVar2);
  (this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__Texture3DSpecCase_00d24d20;
  this->m_internalFormat = internalFormat;
  this->m_format = 0;
  this->m_dataType = 0;
  TVar1 = glu::getTransferFormat((this->super_TextureCubeSpecCase).m_texFormat);
  this->m_format = TVar1.format;
  this->m_dataType = TVar1.dataType;
  return;
}

Assistant:

RandomOrderTexImageCubeCase (Context& context, const char* name, const char* desc, deUint32 internalFormat, int size)
		: TextureCubeSpecCase	(context, name, desc, glu::mapGLInternalFormat(internalFormat), size, deLog2Floor32(size)+1)
		, m_internalFormat		(internalFormat)
		, m_format				(GL_NONE)
		, m_dataType			(GL_NONE)
	{
		glu::TransferFormat fmt = glu::getTransferFormat(m_texFormat);
		m_format	= fmt.format;
		m_dataType	= fmt.dataType;
	}